

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sales.h
# Opt level: O1

void __thiscall L15_4::LabeledSales::NBadIndex::~NBadIndex(NBadIndex *this)

{
  ~NBadIndex(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~NBadIndex() throw() {}